

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O1

void add_codepoint(BMFONT_PARSER *parser,int codepoint)

{
  int iVar1;
  int iVar2;
  BMFONT_CHAR **ppBVar3;
  BMFONT_RANGE *pBVar4;
  long lVar5;
  BMFONT_RANGE *pBVar6;
  
  pBVar6 = (BMFONT_RANGE *)parser->font->data;
  pBVar4 = (BMFONT_RANGE *)0x0;
  while (pBVar6 = pBVar6->next, pBVar6 != (BMFONT_RANGE *)0x0) {
    iVar1 = pBVar6->first;
    if (iVar1 + -1 == codepoint) {
      pBVar6->first = iVar1 + -1;
      iVar1 = pBVar6->count;
      pBVar6->count = iVar1 + 1;
      ppBVar3 = (BMFONT_CHAR **)
                al_realloc_with_context
                          (pBVar6->characters,(long)iVar1 * 8 + 8,0x3c,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                           ,"reallocate");
      pBVar6->characters = ppBVar3;
      memmove(ppBVar3 + 1,ppBVar3,(long)pBVar6->count * 8 - 8);
      *pBVar6->characters = parser->c;
      return;
    }
    if (codepoint < iVar1) break;
    iVar2 = pBVar6->count;
    pBVar4 = pBVar6;
    if (iVar1 + iVar2 == codepoint) {
      pBVar6->count = iVar2 + 1;
      ppBVar3 = (BMFONT_CHAR **)
                al_realloc_with_context
                          (pBVar6->characters,(long)iVar2 * 8 + 8,0x3c,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                           ,"reallocate");
      pBVar6->characters = ppBVar3;
      iVar1 = pBVar6->count;
      ppBVar3[(long)iVar1 + -1] = parser->c;
      pBVar4 = pBVar6->next;
      if ((pBVar4 != (BMFONT_RANGE *)0x0) && (pBVar4->first + -1 == codepoint)) {
        lVar5 = (long)pBVar4->count + (long)iVar1;
        pBVar6->count = (int)lVar5;
        ppBVar3 = (BMFONT_CHAR **)
                  al_realloc_with_context
                            (pBVar6->characters,lVar5 * 8,0x3c,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                             ,"reallocate");
        pBVar6->characters = ppBVar3;
        memmove(ppBVar3 + ((long)pBVar6->count - (long)pBVar4->count),pBVar4->characters,
                (long)pBVar4->count * 8);
        pBVar6->next = pBVar4->next;
        al_free_with_context
                  (pBVar4->characters,0x57,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                   ,"combine_ranges");
        al_free_with_context
                  (pBVar4,0x58,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/font/bmfont.c"
                   ,"combine_ranges");
        return;
      }
      return;
    }
  }
  insert_new_range(parser,pBVar4,codepoint);
  return;
}

Assistant:

static void add_codepoint(BMFONT_PARSER *parser, int codepoint) {
   ALLEGRO_FONT *font = parser->font;
   BMFONT_DATA *data = font->data;
   BMFONT_RANGE *prev = NULL;
   BMFONT_RANGE *range = data->range_first;
   while (range) {
      if (codepoint == range->first - 1) {
         prepend_char(parser, range);
         return;
      }
      if (codepoint < range->first) {
         insert_new_range(parser, prev, codepoint);
         return;
      }
      if (codepoint == range->first + range->count) {
         append_char(parser, range);
         BMFONT_RANGE *range2 = range->next;
         if (range2 != NULL && codepoint == range2->first - 1) {
            combine_ranges(data, range, range2);
         }
         return;
      }
      prev = range;
      range = range->next;
   }
   insert_new_range(parser, prev, codepoint);
}